

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O1

int session_send_flow(LINK_ENDPOINT_HANDLE link_endpoint,FLOW_HANDLE flow)

{
  SESSION_HANDLE pSVar1;
  int iVar2;
  int iVar3;
  AMQP_VALUE performative;
  LINK_ENDPOINT_INSTANCE *link_endpoint_instance;
  bool bVar4;
  
  iVar2 = 0x4f8;
  if (flow != (FLOW_HANDLE)0x0 && link_endpoint != (LINK_ENDPOINT_HANDLE)0x0) {
    pSVar1 = link_endpoint->session;
    if (pSVar1->session_state == SESSION_STATE_BEGIN_RCVD) {
      iVar2 = flow_set_next_incoming_id(flow,pSVar1->next_incoming_id);
      bVar4 = iVar2 == 0;
      iVar2 = 0x505;
      if (bVar4) {
        iVar2 = 0;
      }
    }
    else {
      iVar2 = 0;
      bVar4 = true;
    }
    if (bVar4) {
      iVar3 = flow_set_next_incoming_id(flow,pSVar1->next_incoming_id);
      iVar2 = 0x511;
      if ((((iVar3 == 0) &&
           (iVar3 = flow_set_incoming_window(flow,pSVar1->incoming_window), iVar3 == 0)) &&
          (iVar3 = flow_set_next_outgoing_id(flow,pSVar1->next_outgoing_id), iVar3 == 0)) &&
         ((iVar3 = flow_set_outgoing_window(flow,pSVar1->outgoing_window), iVar3 == 0 &&
          (iVar3 = flow_set_handle(flow,link_endpoint->output_handle), iVar3 == 0)))) {
        performative = amqpvalue_create_flow(flow);
        if (performative == (AMQP_VALUE)0x0) {
          iVar2 = 0x518;
        }
        else {
          iVar3 = connection_encode_frame
                            (link_endpoint->session->endpoint,performative,(PAYLOAD *)0x0,0,
                             (ON_SEND_COMPLETE)0x0,(void *)0x0);
          iVar2 = 0x51e;
          if (iVar3 == 0) {
            iVar2 = 0;
          }
          amqpvalue_destroy(performative);
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int session_send_flow(LINK_ENDPOINT_HANDLE link_endpoint, FLOW_HANDLE flow)
{
    int result;

    if ((link_endpoint == NULL) ||
        (flow == NULL))
    {
        result = MU_FAILURE;
    }
    else
    {
        LINK_ENDPOINT_INSTANCE* link_endpoint_instance = (LINK_ENDPOINT_INSTANCE*)link_endpoint;
        SESSION_INSTANCE* session_instance = (SESSION_INSTANCE*)link_endpoint_instance->session;

        result = 0;

        if (session_instance->session_state == SESSION_STATE_BEGIN_RCVD)
        {
            if (flow_set_next_incoming_id(flow, session_instance->next_incoming_id) != 0)
            {
                result = MU_FAILURE;
            }
        }

        if (result == 0)
        {
            if ((flow_set_next_incoming_id(flow, session_instance->next_incoming_id) != 0) ||
                (flow_set_incoming_window(flow, session_instance->incoming_window) != 0) ||
                (flow_set_next_outgoing_id(flow, session_instance->next_outgoing_id) != 0) ||
                (flow_set_outgoing_window(flow, session_instance->outgoing_window) != 0) ||
                (flow_set_handle(flow, link_endpoint_instance->output_handle) != 0))
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE flow_performative_value = amqpvalue_create_flow(flow);
                if (flow_performative_value == NULL)
                {
                    result = MU_FAILURE;
                }
                else
                {
                    if (encode_frame(link_endpoint, flow_performative_value, NULL, 0) != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }

                    amqpvalue_destroy(flow_performative_value);
                }
            }
        }
    }

    return result;
}